

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_periodic_boundary_conditions_base.h
# Opt level: O2

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>::
impose_lower_star_filtration_from_vertices
          (Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *this)

{
  double dVar1;
  unsigned_long uVar2;
  pointer pdVar3;
  pointer puVar4;
  pointer puVar5;
  bool bVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  pointer puVar7;
  pointer puVar8;
  reference rVar9;
  Vertices_iterator it;
  unsigned_long coboundary;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cbd;
  iterator __end3;
  vector<bool,_std::allocator<bool>_> is_this_cell_considered;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  Vertices_iterator local_d8;
  size_type local_b0;
  Vertices_iterator local_a8;
  pointer local_88;
  pointer local_80;
  _Bvector_base<std::allocator<bool>_> local_78;
  Vertices_iterator local_50;
  
  local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d8.counter.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_78,
             (long)(this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(bool *)&local_d8,
             (allocator_type *)&local_a8);
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Vertices_iterator::Vertices_iterator(&local_d8,this);
  while( true ) {
    vertices_iterator_end(&local_a8,this);
    bVar6 = Vertices_iterator::operator!=(&local_d8,&local_a8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
    if (!bVar6) break;
    local_a8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)Vertices_iterator::compute_index_in_bitmap(&local_d8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,
               (unsigned_long *)&local_a8);
    Vertices_iterator::operator++(&local_50,&local_d8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8);
  while( true ) {
    local_88 = local_f8._M_impl.super__Vector_impl_data._M_finish;
    if (local_f8._M_impl.super__Vector_impl_data._M_finish ==
        local_f8._M_impl.super__Vector_impl_data._M_start) break;
    local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar7 = local_f8._M_impl.super__Vector_impl_data._M_start;
    while (puVar5 = local_f8._M_impl.super__Vector_impl_data._M_end_of_storage,
          puVar8 = local_f8._M_impl.super__Vector_impl_data._M_finish,
          puVar4 = local_f8._M_impl.super__Vector_impl_data._M_start, puVar7 != local_88) {
      uVar2 = *puVar7;
      (*(this->super_Bitmap_cubical_complex_base<double>)._vptr_Bitmap_cubical_complex_base[3])
                (&local_a8,this,uVar2);
      puVar4 = local_a8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_80 = puVar7;
      for (puVar8 = local_a8.counter.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1) {
        local_b0 = *puVar8;
        pdVar3 = (this->super_Bitmap_cubical_complex_base<double>).data.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar1 = pdVar3[uVar2];
        if (pdVar3[local_b0] <= dVar1 && dVar1 != pdVar3[local_b0]) {
          pdVar3[local_b0] = dVar1;
        }
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&local_78,local_b0);
        if ((*rVar9._M_p & rVar9._M_mask) == 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&local_d8.counter,&local_b0);
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)&local_78,local_b0);
          *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
      puVar7 = local_80 + 1;
    }
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_f8._M_impl.super__Vector_impl_data._M_start =
         local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_f8._M_impl.super__Vector_impl_data._M_finish =
         local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
    local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8;
    local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar5;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_f8);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_78);
  return;
}

Assistant:

void Bitmap_cubical_complex_periodic_boundary_conditions_base<T>::impose_lower_star_filtration_from_vertices() {
  // this vector will be used to check which elements have already been taken care of in imposing lower star filtration
  std::vector<bool> is_this_cell_considered(this->data.size(), false);

  std::vector<std::size_t> indices_to_consider;
  // we assume here that we already have a filtration on the vertices and
  // we have to extend it to higher ones.
  for (auto it = this->vertices_iterator_begin();
       it != this->vertices_iterator_end(); ++it) {
    indices_to_consider.push_back(it.compute_index_in_bitmap());
  }

  while (indices_to_consider.size()) { // Iteration on the dimension
#ifdef DEBUG_TRACES
    std::clog << "indices_to_consider in this iteration \n";
    for (auto index : indices_to_consider) {
      std::clog << index << "  ";
    }
#endif
    std::vector<std::size_t> new_indices_to_consider;
    for (auto index : indices_to_consider) {
      std::vector<std::size_t> cbd = this->get_coboundary_of_a_cell(index);
      for (auto coboundary : cbd) {
#ifdef DEBUG_TRACES
        std::clog << "filtration of a cell : " << coboundary << " is : " << this->data[coboundary]
                  << " while of a cell: " << index << " is: " << this->data[index]
                  << std::endl;
#endif
        if (this->data[coboundary] < this->data[index]) {
          this->data[coboundary] = this->data[index];
#ifdef DEBUG_TRACES
          std::clog << "Setting the value of a cell : " << coboundary
                    << " to : " << this->data[index] << std::endl;
#endif
        }
        if (is_this_cell_considered[coboundary] == false) {
          new_indices_to_consider.push_back(coboundary);
          is_this_cell_considered[coboundary] = true;
        }
      }
    }
    indices_to_consider.swap(new_indices_to_consider);
  }
}